

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall HTTPRequest::~HTTPRequest(HTTPRequest *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> reply;
  string_view str;
  string_view logging_function;
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->replySent == false) {
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar3);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char[13]>
                (&local_58,"%s: Unhandled request\n",(char (*) [13])"~HTTPRequest");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pLVar3 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x57;
      local_58._M_string_length = 0x6e1ac5;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "~HTTPRequest";
      logging_function._M_len = 0xc;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x253,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    reply._M_extent._M_extent_value = 0x11;
    reply._M_ptr = (pointer)"Unhandled request";
    WriteReply(this,500,reply);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPRequest::~HTTPRequest()
{
    if (!replySent) {
        // Keep track of whether reply was sent to avoid request leaks
        LogPrintf("%s: Unhandled request\n", __func__);
        WriteReply(HTTP_INTERNAL_SERVER_ERROR, "Unhandled request");
    }
    // evhttpd cleans up the request, as long as a reply was sent.
}